

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O3

SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>_>
::operator=(SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
            *this,Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>
                  *_rhs)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  ulong uVar4;
  PointerType pdVar5;
  double dVar6;
  Index index_1;
  ulong uVar7;
  long lVar8;
  Index index;
  ulong uVar9;
  ulong uVar10;
  
  uVar4 = (_rhs->
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_0>
          .m_rows.m_value;
  if (*(ulong *)&this->m_matrix->field_0x8 == uVar4) {
    uVar7 = *(ulong *)this->m_matrix;
    uVar9 = (ulong)((uint)(uVar7 >> 3) & 1);
    if ((long)uVar4 <= (long)uVar9) {
      uVar9 = uVar4;
    }
    if ((uVar7 & 7) != 0) {
      uVar9 = uVar4;
    }
    pdVar5 = (_rhs->
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
             ).
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_0>
             .m_data;
    lVar8 = uVar4 - uVar9;
    if (0 < (long)uVar9) {
      uVar10 = 0;
      do {
        *(double *)(uVar7 + uVar10 * 8) = *(double *)(uVar7 + uVar10 * 8) + pdVar5[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    uVar7 = (lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffeU) + uVar9;
    if (1 < lVar8) {
      do {
        dVar6 = (pdVar5 + uVar9)[1];
        pdVar1 = (double *)(*(long *)this->m_matrix + uVar9 * 8);
        dVar3 = pdVar1[1];
        pdVar2 = (double *)(*(long *)this->m_matrix + uVar9 * 8);
        *pdVar2 = pdVar5[uVar9] + *pdVar1;
        pdVar2[1] = dVar6 + dVar3;
        uVar9 = uVar9 + 2;
      } while ((long)uVar9 < (long)uVar7);
    }
    if ((long)uVar7 < (long)uVar4) {
      lVar8 = *(long *)this->m_matrix;
      do {
        *(double *)(lVar8 + uVar7 * 8) = *(double *)(lVar8 + uVar7 * 8) + pdVar5[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    return this;
  }
  __assert_fail("rows() == rhs.rows() && cols() == rhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/SelfCwiseBinaryOp.h"
                ,0x88,
                "SelfCwiseBinaryOp<BinOp, Lhs, Rhs> &Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, Eigen::Map<Eigen::Matrix<double, -1, 1>>, Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>>::lazyAssign(const DenseBase<RhsDerived> &) [BinOp = Eigen::internal::scalar_sum_op<double>, Lhs = Eigen::Map<Eigen::Matrix<double, -1, 1>>, Rhs = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, RhsDerived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>]"
               );
}

Assistant:

SelfCwiseBinaryOp& operator=(const Rhs& _rhs)
    {
      typename internal::nested<Rhs>::type rhs(_rhs);
      return Base::operator=(rhs);
    }